

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O1

void sec_dalloc(tsdn_t *tsdn,pai_t *self,edata_t *edata,_Bool *deferred_work_generated)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  sec_bin_t *psVar3;
  edata_t *peVar4;
  long lVar5;
  int iVar6;
  sec_shard_t *shard;
  ulong uVar7;
  _func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *p_Var8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  mutex_prof_data_t *data;
  pthread_mutex_t *__mutex;
  
  if ((self[1].alloc_batch !=
       (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr *)
       0x0) && ((_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool__Bool_ptr *)
                ((edata->field_2).e_size_esn & 0xfffffffffffff000) <= self[1].expand)) {
    shard = sec_shard_pick(tsdn,(sec_t *)self);
    __mutex = (pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48);
    iVar6 = pthread_mutex_trylock(__mutex);
    if (iVar6 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&shard->mtx);
      (shard->mtx).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(shard->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((shard->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (shard->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(shard->mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    if (shard->enabled == true) {
      uVar7 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
      if (uVar7 < 0x7000000000000001) {
        uVar11 = uVar7 - 1;
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar10 = (uint)lVar5 ^ 0x3f;
        iVar6 = 0x32 - uVar10;
        if (0x32 < uVar10) {
          iVar6 = 0;
        }
        bVar9 = 0xc;
        if (0x4000 < uVar7) {
          bVar9 = (char)iVar6 + 0xb;
        }
        uVar11 = (ulong)(((uint)(uVar11 >> (bVar9 & 0x3f)) & 3) + iVar6 * 4);
      }
      else {
        uVar11 = 199;
      }
      psVar3 = shard->bins;
      (edata->field_5).ql_link_active.qre_next = edata;
      (edata->field_5).ql_link_active.qre_prev = edata;
      peVar4 = psVar3[uVar11].freelist.head.qlh_first;
      if (peVar4 != (edata_t *)0x0) {
        (edata->field_5).ql_link_active.qre_next = (peVar4->field_5).ql_link_active.qre_prev;
        ((psVar3[uVar11].freelist.head.qlh_first)->field_5).ql_link_active.qre_prev = edata;
        (edata->field_5).ql_link_active.qre_prev =
             (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
        peVar4 = psVar3[uVar11].freelist.head.qlh_first;
        (((peVar4->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar4;
        (((edata->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = edata;
      }
      psVar3[uVar11].freelist.head.qlh_first = edata;
      psVar3[uVar11].bytes_cur = psVar3[uVar11].bytes_cur + uVar7;
      p_Var8 = (_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *)
               (uVar7 + shard->bytes_cur);
      shard->bytes_cur = (size_t)p_Var8;
      if (self[1].shrink < p_Var8) {
        sec_flush_some_and_unlock(tsdn,(sec_t *)self,shard);
        return;
      }
      (shard->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
      return;
    }
    (shard->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  (**(code **)(self[1].alloc + 0x20))(tsdn,self[1].alloc,edata,deferred_work_generated);
  return;
}

Assistant:

static void
sec_dalloc(tsdn_t *tsdn, pai_t *self, edata_t *edata,
    bool *deferred_work_generated) {
	sec_t *sec = (sec_t *)self;
	if (sec->opts.nshards == 0
	    || edata_size_get(edata) > sec->opts.max_alloc) {
		pai_dalloc(tsdn, sec->fallback, edata,
		    deferred_work_generated);
		return;
	}
	sec_shard_t *shard = sec_shard_pick(tsdn, sec);
	malloc_mutex_lock(tsdn, &shard->mtx);
	if (shard->enabled) {
		sec_shard_dalloc_and_unlock(tsdn, sec, shard, edata);
	} else {
		malloc_mutex_unlock(tsdn, &shard->mtx);
		pai_dalloc(tsdn, sec->fallback, edata,
		    deferred_work_generated);
	}
}